

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::java::ClassNameResolver::
GetJavaClassFullName<google::protobuf::EnumDescriptor>
          (string *__return_storage_ptr__,ClassNameResolver *this,string_view name_without_package,
          EnumDescriptor *descriptor,bool immutable,bool kotlin)

{
  bool bVar1;
  ulong uVar2;
  ClassNameResolver *pCVar3;
  string_view s;
  FixedMapping replacements;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_f8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  *local_d8;
  undefined8 local_d0;
  ClassNameResolver *local_c8;
  size_t sStack_c0;
  string local_b0;
  string local_90;
  string local_70;
  FileDescriptor *local_40;
  FileDescriptor *file;
  bool kotlin_local;
  EnumDescriptor *pEStack_30;
  bool immutable_local;
  EnumDescriptor *descriptor_local;
  ClassNameResolver *this_local;
  string_view name_without_package_local;
  string *result;
  
  name_without_package_local._M_len = (size_t)name_without_package._M_str;
  pCVar3 = (ClassNameResolver *)name_without_package._M_len;
  file._6_1_ = kotlin;
  file._5_1_ = 0;
  file._7_1_ = immutable;
  pEStack_30 = descriptor;
  descriptor_local = (EnumDescriptor *)this;
  this_local = pCVar3;
  name_without_package_local._M_str = (char *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_40 = EnumDescriptor::file(pEStack_30);
  bVar1 = NestedInFileClass(pEStack_30,(bool)(file._7_1_ & 1));
  if (bVar1) {
    GetClassName_abi_cxx11_(&local_70,this,local_40,(bool)(file._7_1_ & 1),(bool)(file._6_1_ & 1));
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'$');
    }
  }
  else {
    GetFileJavaPackage_abi_cxx11_(&local_90,this,local_40,(bool)(file._7_1_ & 1));
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'.');
    }
  }
  local_c8 = this_local;
  sStack_c0 = name_without_package_local._M_len;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_f8,(char (*) [2])0xb7cf01,(char (*) [2])0xa8989d);
  local_d8 = &local_f8;
  local_d0 = 1;
  s._M_str = (char *)local_d8;
  s._M_len = sStack_c0;
  replacements._M_len = (size_type)pCVar3;
  replacements._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_(&local_b0,(lts_20250127 *)local_c8,s,replacements);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassNameResolver::GetJavaClassFullName(
    absl::string_view name_without_package, const Descriptor& descriptor,
    bool immutable, bool kotlin) {
  std::string result;
  auto file = descriptor.file();
  if (NestedInFileClass(descriptor, immutable)) {
    result = GetClassName(file, immutable, kotlin);
    if (!result.empty()) result += '$';
  } else {
    result = GetFileJavaPackage(file, immutable);
    if (!result.empty()) result += '.';
  }
  result += absl::StrReplaceAll(name_without_package, {{".", "$"}});
  return result;
}